

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nrom.cpp
# Opt level: O0

uint8_t __thiscall n_e_s::core::Nrom::ppu_read_byte(Nrom *this,uint16_t addr)

{
  Mirroring m;
  const_reference pvVar1;
  INesHeader *this_00;
  pair<int,_unsigned_short> pVar2;
  type_conflict4 *ptVar3;
  type_conflict5 *ptVar4;
  const_reference this_01;
  const_reference pvVar5;
  type *addr_mod;
  type *index;
  unsigned_short local_20;
  uint16_t local_1a;
  Nrom *pNStack_18;
  uint16_t addr_local;
  Nrom *this_local;
  
  local_1a = addr;
  pNStack_18 = this;
  if (addr < 0x2000) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&this->chr_rom_,(ulong)addr);
    this_local._7_1_ = *pvVar1;
  }
  else {
    this_00 = IRom::header(&this->super_IRom);
    m = INesHeader::mirroring(this_00);
    pVar2 = translate_nametable_addr(this,addr,m);
    index._4_4_ = pVar2.first;
    local_20 = pVar2.second;
    ptVar3 = std::get<0ul,int,unsigned_short>((pair<int,_unsigned_short> *)((long)&index + 4));
    ptVar4 = std::get<1ul,int,unsigned_short>((pair<int,_unsigned_short> *)((long)&index + 4));
    this_01 = std::array<std::array<unsigned_char,_1024UL>,_2UL>::operator[]
                        (&this->nametables_,(long)*ptVar3);
    pvVar5 = std::array<unsigned_char,_1024UL>::operator[](this_01,(ulong)*ptVar4);
    this_local._7_1_ = *pvVar5;
  }
  return this_local._7_1_;
}

Assistant:

uint8_t Nrom::ppu_read_byte(uint16_t addr) const {
    if (addr <= kChrEnd) {
        return chr_rom_.at(addr);
    }
    const auto [index, addr_mod] =
            translate_nametable_addr(addr, header().mirroring());
    return nametables_[index][addr_mod];
}